

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  long lVar5;
  size_type sVar6;
  initializer_list<char> __l;
  string value;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  vector<char,_std::allocator<char>_> delims;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 *local_78;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_70;
  char *local_68 [2];
  char local_58 [16];
  vector<char,_std::allocator<char>_> local_48;
  
  local_98._M_dataplus._M_p._0_2_ = 0x2227;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_98;
  std::vector<char,_std::allocator<char>_>::vector(&local_48,__l,(allocator_type *)local_68);
  local_68[0] = (str->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = local_68[0] + str->_M_string_length;
  ::std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
            (&local_78,&local_98,local_68);
  str->_M_string_length = (long)local_78 - (long)(str->_M_dataplus)._M_p;
  *local_78 = 0;
  _Var4 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar2 = (str->_M_dataplus)._M_p;
  if (pcVar2 + str->_M_string_length == _Var4._M_current) {
    str->_M_string_length = 0;
    *pcVar2 = '\0';
  }
  else {
    ::std::__cxx11::string::_M_erase((ulong)str,0);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar6 = str->_M_string_length;
  if (sVar6 != 0) {
    paVar1 = &local_98.field_2;
    local_70 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__;
    do {
      pcVar3 = (str->_M_dataplus)._M_p;
      if (*pcVar3 == '\"') {
        lVar5 = ::std::__cxx11::string::find((char)str,0x22);
        if (lVar5 == -1) {
          ::std::__cxx11::string::substr((ulong)&local_98,(ulong)str);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          ::std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x15c27c);
        }
        else {
          ::std::__cxx11::string::substr((ulong)&local_98,(ulong)str);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          ::std::__cxx11::string::substr((ulong)&local_98,(ulong)str);
LAB_0012e640:
          ::std::__cxx11::string::operator=((string *)str,(string *)&local_98);
joined_r0x0012e6dc:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p);
          }
        }
      }
      else if (*pcVar3 == '\'') {
        lVar5 = ::std::__cxx11::string::find((char)str,0x27);
        if (lVar5 != -1) {
          ::std::__cxx11::string::substr((ulong)&local_98,(ulong)str);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          ::std::__cxx11::string::substr((ulong)&local_98,(ulong)str);
          goto LAB_0012e640;
        }
        ::std::__cxx11::string::substr((ulong)&local_98,(ulong)str);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        ::std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x15c27c);
      }
      else {
        _Var4 = ::std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::split_up(std::__cxx11::string)::_lambda(char)_1_>>
                          (pcVar3,pcVar3 + sVar6);
        pcVar2 = (str->_M_dataplus)._M_p;
        if (_Var4._M_current != pcVar2 + str->_M_string_length) {
          local_98._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_98,pcVar2,_Var4._M_current);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_98);
          local_68[0] = local_58;
          ::std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)local_68,_Var4._M_current,
                     (str->_M_dataplus)._M_p + str->_M_string_length);
          ::std::__cxx11::string::operator=((string *)str,(string *)local_68);
          __return_storage_ptr__ =
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_70;
          if (local_68[0] != local_58) {
            operator_delete(local_68[0]);
            __return_storage_ptr__ =
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70;
          }
          goto joined_r0x0012e6dc;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,str);
        ::std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x15c27c);
      }
      local_68[0] = (str->_M_dataplus)._M_p;
      local_98._M_dataplus._M_p = local_68[0] + str->_M_string_length;
      ::std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                (&local_78,&local_98,local_68);
      str->_M_string_length = (long)local_78 - (long)(str->_M_dataplus)._M_p;
      *local_78 = 0;
      _Var4 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                        ();
      pcVar2 = (str->_M_dataplus)._M_p;
      if (pcVar2 + str->_M_string_length == _Var4._M_current) {
        str->_M_string_length = 0;
        *pcVar2 = '\0';
      }
      else {
        ::std::__cxx11::string::_M_erase((ulong)str,0);
      }
      sVar6 = str->_M_string_length;
    } while (sVar6 != 0);
  }
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
            __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split_up(std::string str) {

    std::vector<char> delims = {'\'', '\"'};
    auto find_ws = [](char ch) { return std::isspace<char>(ch, std::locale()); };
    trim(str);

    std::vector<std::string> output;

    while(!str.empty()) {
        if(str[0] == '\'') {
            auto end = str.find('\'', 1);
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                str = str.substr(end + 1);
            } else {
                output.push_back(str.substr(1));
                str = "";
            }
        } else if(str[0] == '\"') {
            auto end = str.find('\"', 1);
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                str = str.substr(end + 1);
            } else {
                output.push_back(str.substr(1));
                str = "";
            }

        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it, str.end());
            } else {
                output.push_back(str);
                str = "";
            }
        }
        trim(str);
    }

    return output;
}